

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O1

idx_t __thiscall
duckdb::IEJoinUnion::JoinComplexBlocks
          (IEJoinUnion *this,SelectionVector *lsel,SelectionVector *rsel)

{
  uint uVar1;
  idx_t n;
  ulong uVar2;
  bool bVar3;
  idx_t iVar4;
  ulong uVar5;
  idx_t j;
  uint *puVar6;
  idx_t iVar7;
  ulong n_00;
  
  iVar7 = 0;
LAB_00bdbf66:
  if (this->n <= this->i) {
    return iVar7;
  }
  do {
    n = this->bloom_count;
    uVar2 = this->n;
    j = this->j;
    do {
      if (uVar2 <= j) break;
      iVar4 = NextValid(&this->bloom_filter,j >> 10,n);
      uVar5 = iVar4 * 0x400;
      n_00 = uVar5 + 0x400;
      if (uVar2 < uVar5 + 0x400) {
        n_00 = uVar2;
      }
      if (j <= uVar5) {
        j = uVar5;
      }
      this->j = j;
      j = NextValid(&this->bit_mask,j,n_00);
      this->j = j;
    } while (n_00 <= j);
    if (uVar2 <= this->j) break;
    puVar6 = (uint *)vector<long,_true>::operator[](&this->li,this->j);
    uVar1 = *puVar6;
    this->j = this->j + 1;
    lsel->sel_vector[iVar7] = (int)this->lrid - 1;
    rsel->sel_vector[iVar7] = ~uVar1;
    iVar7 = iVar7 + 1;
    if (iVar7 == 0x800) {
      return 0x800;
    }
  } while( true );
  this->i = this->i + 1;
  bVar3 = NextRow(this);
  if (!bVar3) {
    return iVar7;
  }
  goto LAB_00bdbf66;
}

Assistant:

idx_t IEJoinUnion::JoinComplexBlocks(SelectionVector &lsel, SelectionVector &rsel) {
	// 8. initialize join result as an empty list for tuple pairs
	idx_t result_count = 0;

	// 11. for(i←1 to n) do
	while (i < n) {
		// 13. for (j ← pos+eqOff to n) do
		for (;;) {
			// 14. if B[j] = 1 then

			//	Use the Bloom filter to find candidate blocks
			while (j < n) {
				auto bloom_begin = NextValid(bloom_filter, j / BLOOM_CHUNK_BITS, bloom_count) * BLOOM_CHUNK_BITS;
				auto bloom_end = MinValue<idx_t>(n, bloom_begin + BLOOM_CHUNK_BITS);

				j = MaxValue<idx_t>(j, bloom_begin);
				j = NextValid(bit_mask, j, bloom_end);
				if (j < bloom_end) {
					break;
				}
			}

			if (j >= n) {
				break;
			}

			// Filter out tuples with the same sign (they come from the same table)
			const auto rrid = li[j];
			++j;

			D_ASSERT(lrid > 0 && rrid < 0);
			// 15. add tuples w.r.t. (L1[j], L1[i]) to join result
			lsel.set_index(result_count, sel_t(+lrid - 1));
			rsel.set_index(result_count, sel_t(-rrid - 1));
			++result_count;
			if (result_count == STANDARD_VECTOR_SIZE) {
				// out of space!
				return result_count;
			}
		}
		++i;

		if (!NextRow()) {
			break;
		}
	}

	return result_count;
}